

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinderTester_0000_0999.cpp
# Opt level: O0

void __thiscall psy::C::DeclarationBinderTester::case0158(DeclarationBinderTester *this)

{
  Decl *pDVar1;
  Ty *pTVar2;
  Expectation *pEVar3;
  socklen_t __len;
  allocator<char> local_7a1;
  string local_7a0;
  allocator<char> local_779;
  string local_778;
  Decl local_758;
  Decl local_690;
  allocator<char> local_5c1;
  string local_5c0;
  allocator<char> local_599;
  string local_598;
  Decl local_578;
  Decl local_4b0;
  allocator<char> local_3e1;
  string local_3e0;
  allocator<char> local_3b9;
  string local_3b8;
  allocator<char> local_391;
  string local_390;
  allocator<char> local_369;
  string local_368;
  Decl local_348;
  Decl local_280;
  Expectation local_1b8;
  Expectation local_100;
  allocator<char> local_31;
  string local_30 [32];
  DeclarationBinderTester *local_10;
  DeclarationBinderTester *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,"x y ( z const * w , u * v) { }",&local_31);
  Expectation::Expectation(&local_1b8);
  Decl::Decl(&local_348);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,"y",&local_369);
  pDVar1 = Decl::Function(&local_348,&local_368,File);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_390,"x",&local_391);
  pDVar1 = Ty::Typedef(&pDVar1->ty_,&local_390,None);
  pDVar1 = Ty::Derived(&pDVar1->ty_,Function,None,None);
  pTVar2 = Ty::addParam(&pDVar1->ty_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,"z",&local_3b9);
  pDVar1 = Ty::Typedef(pTVar2,&local_3b8,Const);
  pTVar2 = Ty::atParam(&pDVar1->ty_);
  pDVar1 = Ty::Derived(pTVar2,Pointer,None,None);
  pTVar2 = Ty::addParam(&pDVar1->ty_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e0,"u",&local_3e1);
  pDVar1 = Ty::Typedef(pTVar2,&local_3e0,None);
  pTVar2 = Ty::atParam(&pDVar1->ty_);
  pDVar1 = Ty::Derived(pTVar2,Pointer,None,None);
  Decl::Decl(&local_280,pDVar1);
  pEVar3 = Expectation::declaration(&local_1b8,&local_280);
  Decl::Decl(&local_578);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_598,"w",&local_599);
  pDVar1 = Decl::Object(&local_578,&local_598,ParameterDeclaration,Block);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5c0,"z",&local_5c1);
  pDVar1 = Ty::Typedef(&pDVar1->ty_,&local_5c0,Const);
  pDVar1 = Ty::Derived(&pDVar1->ty_,Pointer,None,None);
  Decl::Decl(&local_4b0,pDVar1);
  pEVar3 = Expectation::declaration(pEVar3,&local_4b0);
  Decl::Decl(&local_758);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_778,"v",&local_779);
  pDVar1 = Decl::Object(&local_758,&local_778,ParameterDeclaration,Block);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7a0,"u",&local_7a1);
  pDVar1 = Ty::Typedef(&pDVar1->ty_,&local_7a0,None);
  __len = 0;
  pDVar1 = Ty::Derived(&pDVar1->ty_,Pointer,None,None);
  Decl::Decl(&local_690,pDVar1);
  pEVar3 = Expectation::declaration(pEVar3,&local_690);
  Expectation::Expectation(&local_100,pEVar3);
  bind(this,(int)local_30,(sockaddr *)&local_100,__len);
  Expectation::~Expectation(&local_100);
  Decl::~Decl(&local_690);
  std::__cxx11::string::~string((string *)&local_7a0);
  std::allocator<char>::~allocator(&local_7a1);
  std::__cxx11::string::~string((string *)&local_778);
  std::allocator<char>::~allocator(&local_779);
  Decl::~Decl(&local_758);
  Decl::~Decl(&local_4b0);
  std::__cxx11::string::~string((string *)&local_5c0);
  std::allocator<char>::~allocator(&local_5c1);
  std::__cxx11::string::~string((string *)&local_598);
  std::allocator<char>::~allocator(&local_599);
  Decl::~Decl(&local_578);
  Decl::~Decl(&local_280);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::allocator<char>::~allocator(&local_3e1);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::allocator<char>::~allocator(&local_3b9);
  std::__cxx11::string::~string((string *)&local_390);
  std::allocator<char>::~allocator(&local_391);
  std::__cxx11::string::~string((string *)&local_368);
  std::allocator<char>::~allocator(&local_369);
  Decl::~Decl(&local_348);
  Expectation::~Expectation(&local_1b8);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

void DeclarationBinderTester::case0158()
{
    bind("x y ( z const * w , u * v) { }",
         Expectation()
         .declaration(Decl()
                  .Function("y", ScopeKind::File)
                  .ty_.Typedef("x")
                  .ty_.Derived(TypeKind::Function)
                  .ty_.addParam().Typedef("z",  CVR::Const)
                  .ty_.atParam().Derived(TypeKind::Pointer)
                  .ty_.addParam().Typedef("u")
                  .ty_.atParam().Derived(TypeKind::Pointer))
         .declaration(Decl()
                  .Object("w", SymbolKind::ParameterDeclaration, ScopeKind::Block)
                  .ty_.Typedef("z",  CVR::Const)
                  .ty_.Derived(TypeKind::Pointer))
         .declaration(Decl()
                  .Object("v", SymbolKind::ParameterDeclaration, ScopeKind::Block)
                  .ty_.Typedef("u")
                  .ty_.Derived(TypeKind::Pointer)));
}